

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

uhugeint_t duckdb::Cast::Operation<duckdb::uhugeint_t,_duckdb::uhugeint_t>(uhugeint_t input)

{
  uhugeint_t input_00;
  bool bVar1;
  InvalidInputException *this;
  uhugeint_t result;
  undefined1 in_stack_00000180 [16];
  string *in_stack_ffffffffffffff78;
  bool in_stack_ffffffffffffff8f;
  uhugeint_t *in_stack_ffffffffffffff90;
  uint64_t in_stack_ffffffffffffff98;
  uint64_t in_stack_ffffffffffffffa0;
  uhugeint_t local_10;
  
  input_00.upper = in_stack_ffffffffffffffa0;
  input_00.lower = in_stack_ffffffffffffff98;
  bVar1 = TryCast::Operation<duckdb::uhugeint_t,_duckdb::uhugeint_t>
                    (input_00,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
  if (!bVar1) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    CastExceptionText<duckdb::uhugeint_t,_duckdb::uhugeint_t>((uhugeint_t)in_stack_00000180);
    InvalidInputException::InvalidInputException(this,in_stack_ffffffffffffff78);
    __cxa_throw(this,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException)
    ;
  }
  return local_10;
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}